

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_Ofs8_Data16(VGMPlayer *this)

{
  UINT16 UVar1;
  CHIP_DEVICE *pCVar2;
  UINT16 value;
  CHIP_DEVICE *cDev;
  UINT8 chipID;
  UINT8 chipType;
  VGMPlayer *this_local;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        (UINT8)((int)(this->_fileData[(ulong)this->_filePos + 1] & 0x80) >> 7));
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->writeD16 != (DEVFUNC_WRITE_A8D16)0x0)) {
    UVar1 = ReadLE16(this->_fileData + (ulong)this->_filePos + 2);
    (*pCVar2->writeD16)((pCVar2->base).defInf.dataPtr,
                        this->_fileData[(ulong)this->_filePos + 1] & 0x7f,UVar1);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Ofs8_Data16(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeD16 == NULL)
		return;
	
	UINT16 value = ReadLE16(&fData[0x02]);
	cDev->writeD16(cDev->base.defInf.dataPtr, fData[0x01] & 0x7F, value);
	return;
}